

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  long lVar21;
  BYTE *pBVar22;
  seqDef *psVar23;
  BYTE *ip;
  BYTE *pBVar24;
  BYTE *pBVar25;
  ulong *puVar26;
  uint uVar27;
  uint uVar28;
  U32 UVar29;
  int iVar30;
  uint uVar31;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  ulong *local_138;
  uint local_12c;
  ulong local_128;
  uint local_10c;
  ulong local_f0;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar9 = (ms->window).base;
  pBVar10 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar9 + uVar5;
  local_12c = *rep;
  local_10c = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_138 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (puVar4 <= local_138) {
LAB_0016822f:
    *rep = local_12c;
    rep[1] = local_10c;
    return (long)iEnd - (long)src;
  }
  puVar1 = (ulong *)((long)iEnd - 7);
  puVar2 = (ulong *)((long)iEnd - 3);
  puVar3 = (ulong *)((long)iEnd - 1);
LAB_001676b4:
  puVar20 = (ulong *)((long)local_138 + 1);
  UVar29 = (U32)local_138;
  uVar13 = ((UVar29 - (int)pBVar9) - local_12c) + 1;
  pBVar25 = pBVar9;
  if (uVar13 < uVar5) {
    pBVar25 = pBVar10;
  }
  if ((uVar13 <= uVar6 || (uVar5 - 1) - uVar13 < 3) ||
     (*(int *)puVar20 != *(int *)(pBVar25 + uVar13))) {
    if (cParams->searchLength - 6 < 2) {
      pUVar11 = ms->chainTable;
      uVar31 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar25 = (ms->window).base;
      pBVar22 = (ms->window).dictBase;
      uVar13 = (ms->window).dictLimit;
      uVar7 = (ms->window).lowLimit;
      uVar27 = UVar29 - (int)pBVar25;
      uVar28 = uVar27 - uVar31;
      if (uVar27 < uVar31) {
        uVar28 = 0;
      }
      uVar8 = cParams->searchLog;
      uVar14 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar29);
      if (uVar7 < uVar14) {
        iVar30 = 1 << ((byte)uVar8 & 0x1f);
        local_f0 = 99999999;
        local_128 = 3;
        do {
          uVar16 = (ulong)uVar14;
          if (uVar14 < uVar13) {
            if (*(int *)(pBVar22 + uVar16) == (int)*local_138) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_138 + 4),pBVar22 + uVar16 + 4,(BYTE *)iEnd,
                                  pBVar22 + uVar13,pBVar25 + uVar13);
              uVar16 = sVar15 + 4;
LAB_001679ae:
              if ((local_128 < uVar16) &&
                 (local_f0 = (ulong)((uVar27 + 2) - uVar14), local_128 = uVar16,
                 (ulong *)((long)local_138 + uVar16) == iEnd)) goto LAB_00167f52;
            }
          }
          else {
            puVar26 = (ulong *)(pBVar25 + uVar16);
            if (*(BYTE *)(local_128 + (long)puVar26) == *(BYTE *)((long)local_138 + local_128)) {
              puVar17 = local_138;
              if (local_138 < puVar1) {
                if (*puVar26 == *local_138) {
                  lVar21 = 0;
                  do {
                    puVar17 = (ulong *)((long)local_138 + lVar21 + 8);
                    if (puVar1 <= puVar17) {
                      puVar26 = (ulong *)(pBVar25 + lVar21 + uVar16 + 8);
                      goto LAB_00167965;
                    }
                    lVar12 = lVar21 + uVar16 + 8;
                    lVar21 = lVar21 + 8;
                  } while (*(ulong *)(pBVar25 + lVar12) == *puVar17);
                  uVar19 = *puVar17 ^ *(ulong *)(pBVar25 + lVar12);
                  uVar16 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar21;
                }
                else {
                  uVar19 = *local_138 ^ *puVar26;
                  uVar16 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = uVar16 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00167965:
                if ((puVar17 < puVar2) && ((int)*puVar26 == (int)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 4);
                  puVar26 = (ulong *)((long)puVar26 + 4);
                }
                if ((puVar17 < puVar3) && ((short)*puVar26 == (short)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 2);
                  puVar26 = (ulong *)((long)puVar26 + 2);
                }
                if (puVar17 < iEnd) {
                  puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar17));
                }
                uVar16 = (long)puVar17 - (long)local_138;
              }
              goto LAB_001679ae;
            }
          }
          if ((uVar14 <= uVar28) ||
             ((uVar14 = pUVar11[uVar14 & uVar31 - 1], uVar14 <= uVar7 ||
              (iVar30 = iVar30 + -1, iVar30 == 0)))) goto LAB_00167f52;
        } while( true );
      }
    }
    else if (cParams->searchLength == 5) {
      pUVar11 = ms->chainTable;
      uVar31 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar25 = (ms->window).base;
      pBVar22 = (ms->window).dictBase;
      uVar13 = (ms->window).dictLimit;
      uVar7 = (ms->window).lowLimit;
      uVar27 = UVar29 - (int)pBVar25;
      uVar28 = uVar27 - uVar31;
      if (uVar27 < uVar31) {
        uVar28 = 0;
      }
      uVar8 = cParams->searchLog;
      uVar14 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar29);
      if (uVar7 < uVar14) {
        iVar30 = 1 << ((byte)uVar8 & 0x1f);
        local_f0 = 99999999;
        local_128 = 3;
        do {
          uVar16 = (ulong)uVar14;
          if (uVar14 < uVar13) {
            if (*(int *)(pBVar22 + uVar16) == (int)*local_138) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_138 + 4),pBVar22 + uVar16 + 4,(BYTE *)iEnd,
                                  pBVar22 + uVar13,pBVar25 + uVar13);
              uVar16 = sVar15 + 4;
LAB_00167c60:
              if ((local_128 < uVar16) &&
                 (local_f0 = (ulong)((uVar27 + 2) - uVar14), local_128 = uVar16,
                 (ulong *)((long)local_138 + uVar16) == iEnd)) goto LAB_00167f52;
            }
          }
          else {
            puVar26 = (ulong *)(pBVar25 + uVar16);
            if (*(BYTE *)(local_128 + (long)puVar26) == *(BYTE *)((long)local_138 + local_128)) {
              puVar17 = local_138;
              if (local_138 < puVar1) {
                if (*puVar26 == *local_138) {
                  lVar21 = 0;
                  do {
                    puVar17 = (ulong *)((long)local_138 + lVar21 + 8);
                    if (puVar1 <= puVar17) {
                      puVar26 = (ulong *)(pBVar25 + lVar21 + uVar16 + 8);
                      goto LAB_00167c17;
                    }
                    lVar12 = lVar21 + uVar16 + 8;
                    lVar21 = lVar21 + 8;
                  } while (*(ulong *)(pBVar25 + lVar12) == *puVar17);
                  uVar19 = *puVar17 ^ *(ulong *)(pBVar25 + lVar12);
                  uVar16 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar21;
                }
                else {
                  uVar19 = *local_138 ^ *puVar26;
                  uVar16 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = uVar16 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00167c17:
                if ((puVar17 < puVar2) && ((int)*puVar26 == (int)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 4);
                  puVar26 = (ulong *)((long)puVar26 + 4);
                }
                if ((puVar17 < puVar3) && ((short)*puVar26 == (short)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 2);
                  puVar26 = (ulong *)((long)puVar26 + 2);
                }
                if (puVar17 < iEnd) {
                  puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar17));
                }
                uVar16 = (long)puVar17 - (long)local_138;
              }
              goto LAB_00167c60;
            }
          }
          if ((uVar14 <= uVar28) ||
             ((uVar14 = pUVar11[uVar14 & uVar31 - 1], uVar14 <= uVar7 ||
              (iVar30 = iVar30 + -1, iVar30 == 0)))) goto LAB_00167f52;
        } while( true );
      }
    }
    else {
      pUVar11 = ms->chainTable;
      uVar31 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar25 = (ms->window).base;
      pBVar22 = (ms->window).dictBase;
      uVar13 = (ms->window).dictLimit;
      uVar7 = (ms->window).lowLimit;
      uVar28 = UVar29 - (int)pBVar25;
      uVar27 = uVar28 - uVar31;
      if (uVar28 < uVar31) {
        uVar27 = 0;
      }
      uVar8 = cParams->searchLog;
      uVar14 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar29);
      if (uVar7 < uVar14) {
        iVar30 = 1 << ((byte)uVar8 & 0x1f);
        local_f0 = 99999999;
        uVar16 = 3;
        do {
          uVar19 = (ulong)uVar14;
          if (uVar14 < uVar13) {
            if (*(int *)(pBVar22 + uVar19) == (int)*local_138) {
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_138 + 4),pBVar22 + uVar19 + 4,(BYTE *)iEnd,
                                  pBVar22 + uVar13,pBVar25 + uVar13);
              local_128 = sVar15 + 4;
LAB_00167f0f:
              if ((uVar16 < local_128) &&
                 (local_f0 = (ulong)((uVar28 + 2) - uVar14), uVar16 = local_128,
                 (ulong *)((long)local_138 + local_128) == iEnd)) goto LAB_00167f52;
            }
          }
          else {
            puVar26 = (ulong *)(pBVar25 + uVar19);
            if (*(BYTE *)(uVar16 + (long)puVar26) == *(BYTE *)((long)local_138 + uVar16)) {
              puVar17 = local_138;
              if (local_138 < puVar1) {
                if (*puVar26 == *local_138) {
                  lVar21 = 0;
                  do {
                    puVar17 = (ulong *)((long)local_138 + lVar21 + 8);
                    if (puVar1 <= puVar17) {
                      puVar26 = (ulong *)(pBVar25 + lVar21 + uVar19 + 8);
                      goto LAB_00167ec6;
                    }
                    lVar12 = lVar21 + uVar19 + 8;
                    lVar21 = lVar21 + 8;
                  } while (*(ulong *)(pBVar25 + lVar12) == *puVar17);
                  uVar18 = *puVar17 ^ *(ulong *)(pBVar25 + lVar12);
                  uVar19 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  local_128 = (uVar19 >> 3 & 0x1fffffff) + lVar21;
                }
                else {
                  uVar18 = *local_138 ^ *puVar26;
                  uVar19 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  local_128 = uVar19 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00167ec6:
                if ((puVar17 < puVar2) && ((int)*puVar26 == (int)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 4);
                  puVar26 = (ulong *)((long)puVar26 + 4);
                }
                if ((puVar17 < puVar3) && ((short)*puVar26 == (short)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 2);
                  puVar26 = (ulong *)((long)puVar26 + 2);
                }
                if (puVar17 < iEnd) {
                  puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar17));
                }
                local_128 = (long)puVar17 - (long)local_138;
              }
              goto LAB_00167f0f;
            }
          }
          local_128 = uVar16;
          if ((uVar14 <= uVar27) ||
             ((uVar14 = pUVar11[uVar14 & uVar31 - 1], uVar14 <= uVar7 ||
              (iVar30 = iVar30 + -1, uVar16 = local_128, iVar30 == 0)))) goto LAB_00167f52;
        } while( true );
      }
    }
    goto LAB_00167f68;
  }
  puVar26 = iEnd;
  if (uVar13 < uVar5) {
    puVar26 = (ulong *)(pBVar10 + uVar5);
  }
  sVar15 = ZSTD_count_2segments
                     ((BYTE *)((long)local_138 + 5),(BYTE *)((long)(pBVar25 + uVar13) + 4),
                      (BYTE *)iEnd,(BYTE *)puVar26,iStart);
  uVar16 = sVar15 + 4;
  goto LAB_0016801c;
LAB_00167f52:
  if (local_128 != 0) {
    puVar20 = local_138;
  }
  if (local_128 < 4) {
LAB_00167f68:
    local_138 = (ulong *)((long)local_138 + ((long)local_138 - (long)src >> 8) + 1);
  }
  else {
    uVar16 = local_128;
    if (local_f0 == 0) {
LAB_0016801c:
      UVar29 = 1;
    }
    else {
      pBVar24 = (BYTE *)((long)local_138 + (2 - (long)(pBVar9 + local_f0)));
      pBVar22 = iStart;
      pBVar25 = pBVar9;
      if ((uint)pBVar24 < uVar5) {
        pBVar22 = pBVar10 + uVar6;
        pBVar25 = pBVar10;
      }
      if ((src < local_138) && (uVar19 = (ulong)pBVar24 & 0xffffffff, pBVar22 < pBVar25 + uVar19)) {
        pBVar25 = pBVar25 + uVar19;
        do {
          puVar26 = (ulong *)((long)puVar20 + -1);
          pBVar25 = pBVar25 + -1;
          if ((*(BYTE *)puVar26 != *pBVar25) ||
             (uVar16 = uVar16 + 1, puVar20 = puVar26, puVar26 <= src)) break;
        } while (pBVar22 < pBVar25);
      }
      iVar30 = (int)local_f0;
      if (local_128 == 0) {
        iVar30 = 0;
      }
      local_10c = local_12c;
      local_12c = iVar30 - 2;
      UVar29 = iVar30 + 1;
    }
    uVar19 = (long)puVar20 - (long)src;
    puVar17 = (ulong *)seqStore->lit;
    puVar26 = (ulong *)((long)puVar17 + uVar19);
    do {
      *puVar17 = *src;
      puVar17 = puVar17 + 1;
      src = (void *)((long)src + 8);
    } while (puVar17 < puVar26);
    seqStore->lit = seqStore->lit + uVar19;
    if (uVar19 < 0x10000) {
      psVar23 = seqStore->sequences;
    }
    else {
      seqStore->longLengthID = 1;
      psVar23 = seqStore->sequences;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar23->litLength = (U16)uVar19;
    psVar23->offset = UVar29;
    if (0xffff < uVar16 - 3) {
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar23->matchLength = (U16)(uVar16 - 3);
    seqStore->sequences = psVar23 + 1;
    uVar13 = local_12c;
    for (src = (void *)((long)puVar20 + uVar16); local_12c = uVar13, local_138 = (ulong *)src,
        src <= puVar4; src = (void *)((long)src + sVar15 + 4)) {
      uVar13 = (uint)((long)src - (long)(pBVar9 + local_10c));
      pBVar25 = pBVar9;
      if (uVar13 < uVar5) {
        pBVar25 = pBVar10;
      }
      if (((uVar13 <= uVar6) || ((uVar5 - 1) - uVar13 < 3)) ||
         ((int)*src != *(int *)(pBVar25 + ((long)src - (long)(pBVar9 + local_10c) & 0xffffffff))))
      break;
      puVar20 = iEnd;
      if (uVar13 < uVar5) {
        puVar20 = (ulong *)(pBVar10 + uVar5);
      }
      sVar15 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),
                          (BYTE *)((long)(pBVar25 +
                                         ((long)src - (long)(pBVar9 + local_10c) & 0xffffffff)) + 4)
                          ,(BYTE *)iEnd,(BYTE *)puVar20,iStart);
      *(ulong *)seqStore->lit = *src;
      psVar23 = seqStore->sequences;
      psVar23->litLength = 0;
      psVar23->offset = 1;
      if (0xffff < sVar15 + 1) {
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar23 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar23->matchLength = (U16)(sVar15 + 1);
      seqStore->sequences = psVar23 + 1;
      uVar13 = local_10c;
      local_10c = local_12c;
    }
  }
  if (puVar4 <= local_138) goto LAB_0016822f;
  goto LAB_001676b4;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 0);
}